

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_var_thresh_percentile
              (vector_t ***var,float32 **var_thresh,uint32 n_mgau,uint32 n_stream,uint32 n_density,
              uint32 *veclen,float32 percent)

{
  float *pfVar1;
  int *piVar2;
  uint uVar3;
  vector_t pfVar4;
  long lVar5;
  long lVar6;
  vector_t *ppfVar7;
  long lVar8;
  float32 *pfVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong n_elem;
  ulong uVar19;
  float fVar20;
  
  n_elem = (ulong)n_stream;
  pvVar10 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73b);
  pvVar11 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73c);
  pvVar12 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73d);
  if (n_stream != 0) {
    uVar15 = 0;
    do {
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar15],8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x740);
      *(void **)((long)pvVar10 + uVar15 * 8) = pvVar13;
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar15],4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x741);
      *(void **)((long)pvVar11 + uVar15 * 8) = pvVar13;
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar15],4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x742);
      *(void **)((long)pvVar12 + uVar15 * 8) = pvVar13;
      if (veclen[uVar15] != 0) {
        uVar19 = 0;
        do {
          pvVar13 = __ckd_calloc__(4000,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                   ,0x744);
          *(void **)(*(long *)((long)pvVar10 + uVar15 * 8) + uVar19 * 8) = pvVar13;
          *(undefined4 *)(*(long *)((long)pvVar12 + uVar15 * 8) + uVar19 * 4) = 0x8082ab1e;
          *(undefined4 *)(*(long *)((long)pvVar11 + uVar15 * 8) + uVar19 * 4) = 0x7f7fc99e;
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar15]);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
  }
  if (n_mgau != 0) {
    uVar15 = 0;
    do {
      if (n_stream != 0) {
        uVar19 = 0;
        do {
          if (n_density != 0) {
            uVar3 = veclen[uVar19];
            uVar16 = 0;
            do {
              if ((ulong)uVar3 != 0) {
                pfVar4 = var[uVar15][uVar19][uVar16];
                lVar5 = *(long *)((long)pvVar12 + uVar19 * 8);
                uVar17 = 0;
                do {
                  fVar20 = pfVar4[uVar17];
                  pfVar1 = (float *)(lVar5 + uVar17 * 4);
                  if (*pfVar1 <= fVar20 && fVar20 != *pfVar1) {
                    *(float *)(lVar5 + uVar17 * 4) = fVar20;
                  }
                  fVar20 = pfVar4[uVar17];
                  if ((0.0 < fVar20) &&
                     (lVar6 = *(long *)((long)pvVar11 + uVar19 * 8),
                     fVar20 < *(float *)(lVar6 + uVar17 * 4))) {
                    *(float *)(lVar6 + uVar17 * 4) = fVar20;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar3 != uVar17);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != n_density);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != n_elem);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_mgau);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x759,"var_extrema:\n");
  if (n_stream != 0) {
    uVar15 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",uVar15 & 0xffffffff);
      if (veclen[uVar15] != 0) {
        uVar19 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t[%.4e %.4e]",
                  (double)*(float *)(*(long *)((long)pvVar11 + uVar15 * 8) + uVar19 * 4));
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar15]);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
    uVar15 = 0;
    do {
      uVar3 = veclen[uVar15];
      if ((ulong)uVar3 != 0) {
        lVar5 = *(long *)((long)pvVar12 + uVar15 * 8);
        lVar6 = *(long *)((long)pvVar11 + uVar15 * 8);
        uVar19 = 0;
        do {
          *(float *)(lVar5 + uVar19 * 4) =
               (*(float *)(lVar5 + uVar19 * 4) - *(float *)(lVar6 + uVar19 * 4)) / 4000.0;
          uVar19 = uVar19 + 1;
        } while (uVar3 != uVar19);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
    uVar15 = 0;
    do {
      if (veclen[uVar15] != 0) {
        uVar19 = 0;
        do {
          if (n_mgau != 0) {
            uVar16 = 0;
            do {
              if (n_density != 0) {
                ppfVar7 = var[uVar16][uVar15];
                uVar17 = 0;
                do {
                  if (0.0 < ppfVar7[uVar17][uVar19]) {
                    fVar20 = floorf((ppfVar7[uVar17][uVar19] -
                                    *(float *)(*(long *)((long)pvVar11 + uVar15 * 8) + uVar19 * 4))
                                    / *(float *)(*(long *)((long)pvVar12 + uVar15 * 8) + uVar19 * 4)
                                   );
                    piVar2 = (int *)(*(long *)(*(long *)((long)pvVar10 + uVar15 * 8) + uVar19 * 8) +
                                    ((long)fVar20 & 0xffffffffU) * 4);
                    *piVar2 = *piVar2 + 1;
                  }
                  uVar17 = uVar17 + 1;
                } while (n_density != uVar17);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != n_mgau);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar15]);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
  }
  if (n_stream != 0) {
    uVar15 = 0;
    do {
      uVar3 = veclen[uVar15];
      if ((ulong)uVar3 != 0) {
        lVar5 = *(long *)((long)pvVar10 + uVar15 * 8);
        lVar6 = *(long *)((long)pvVar11 + uVar15 * 8);
        lVar8 = *(long *)((long)pvVar12 + uVar15 * 8);
        pfVar9 = var_thresh[uVar15];
        uVar19 = 0;
        do {
          lVar18 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + *(int *)(*(long *)(lVar5 + uVar19 * 8) + lVar18 * 4);
            if ((float)percent / 100.0 < (float)uVar14 / (float)(n_density * n_mgau))
            goto LAB_001156ff;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4000);
          lVar18 = 4000;
LAB_001156ff:
          pfVar9[uVar19] =
               (float32)((float)((int)lVar18 + 1) * *(float *)(lVar8 + uVar19 * 4) +
                        *(float *)(lVar6 + uVar19 * 4));
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar3);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x786,"var_extrema:\n");
  if (n_stream != 0) {
    uVar15 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",uVar15 & 0xffffffff);
      if (veclen[uVar15] != 0) {
        uVar19 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t%.4e",(double)(float)var_thresh[uVar15][uVar19]);
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar15]);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
      uVar15 = uVar15 + 1;
    } while (uVar15 != n_elem);
  }
  return 0;
}

Assistant:

int
gauden_var_thresh_percentile(vector_t ***var,
			     float32 **var_thresh,
			     uint32 n_mgau,
			     uint32 n_stream,
			     uint32 n_density,
			     const uint32 *veclen,
			     float32 percent)
{
    float32 f = percent / 100.0;
    uint32 ***histo;
    float32 **min;
    float32 **max;
    float32 **bin_wdth;
    uint32 i, j, k, l, b, t;
    float32 gt;

    histo = (uint32 ***)ckd_calloc(n_stream, sizeof(uint32 **));
    min = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));
    max = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));

    for (j = 0; j < n_stream; j++) {
	histo[j] = ckd_calloc(veclen[j], sizeof(uint32 *));
	min[j] = ckd_calloc(veclen[j], sizeof(float32));
	max[j] = ckd_calloc(veclen[j], sizeof(float32));
	for (l = 0; l < veclen[j]; l++) {
	    histo[j][l] = ckd_calloc(N_BIN, sizeof(uint32));
	    max[j][l] = MIN_NEG_FLOAT32;
	    min[j][l] = MAX_POS_FLOAT32;
	}
    }

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    if (var[i][j][k][l] > max[j][l]) {
			max[j][l] = var[i][j][k][l];
		    }
		    if ((var[i][j][k][l] > 0) && (var[i][j][k][l] < min[j][l])) {
			min[j][l] = var[i][j][k][l];
		    }
		}
	    }
	}
    }

    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t[%.4e %.4e]", min[j][l], max[j][l]);
	}
        E_INFOCONT("\n");
    }

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    max[j][l] = (max[j][l] - min[j][l]) / (float32)N_BIN;
	}
    }

    bin_wdth = max;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] > 0) {
			b = (uint32)floor((var[i][j][k][l] - min[j][l]) / bin_wdth[j][l]);
			++histo[j][l][b];
		    }
		}
	    }
	}
    }

    /* grand total # of variances for each stream */
    gt = n_mgau * n_density;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    t = 0;
	    for (b = 0; b < N_BIN; b++) {
		t += histo[j][l][b];
		if (((float32)t / gt) > f)
		    break;
	    }
	    var_thresh[j][l] = min[j][l] + (b+1) * bin_wdth[j][l];
	}
    }
    
    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t%.4e", var_thresh[j][l]);
	}
        E_INFOCONT("\n");
    }

    return S3_SUCCESS;
}